

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_extract_all.cpp
# Opt level: O2

void duckdb::RegexpExtractAll::Execute(DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  int iVar2;
  data_ptr_t pdVar3;
  _Alloc_hider _Var4;
  ExpressionState *state_00;
  bool bVar5;
  int32_t iVar6;
  BoundFunctionExpression *pBVar7;
  RegexpBaseBindData *info;
  reference this;
  reference this_00;
  Vector *pVVar8;
  RE2 *pRVar9;
  InvalidInputException *pIVar10;
  long lVar11;
  pointer pRVar12;
  pointer this_01;
  RegexStringPieceArgs *args_00;
  idx_t iVar13;
  idx_t row;
  allocator local_189;
  Vector *local_188;
  unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true> stored_re;
  long local_170;
  unique_ptr<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>,_true>
  non_const_args;
  int32_t group_index;
  ExpressionState *local_140;
  idx_t local_138;
  Options *local_130;
  TemplatedValidityMask<unsigned_long> *local_128;
  StringPiece pattern_strpiece;
  __shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> local_110;
  UnifiedVectorFormat pattern_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  UnifiedVectorFormat strings_data;
  
  local_140 = state;
  pBVar7 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  info = (RegexpBaseBindData *)
         unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
         operator->(&pBVar7->bind_info);
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  local_138 = 1;
  this_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  local_188 = result;
  pVVar8 = ListVector::GetEntry(result);
  UnifiedVectorFormat::UnifiedVectorFormat(&strings_data);
  Vector::ToUnifiedFormat(this,args->count,&strings_data);
  UnifiedVectorFormat::UnifiedVectorFormat(&pattern_data);
  Vector::ToUnifiedFormat(this_00,args->count,&pattern_data);
  ListVector::Reserve(local_188,0x800);
  ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_110,
             (__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&this->auxiliary);
  shared_ptr<duckdb::VectorBuffer,_true>::operator=
            (&pVVar8->auxiliary,(shared_ptr<duckdb::VectorBuffer,_true> *)&local_110);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
  bVar5 = DataChunk::AllConstant(args);
  if (!bVar5) {
    local_138 = args->count;
  }
  non_const_args.
  super_unique_ptr<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::RegexStringPieceArgs_*,_std::default_delete<duckdb::RegexStringPieceArgs>_>
  .super__Head_base<0UL,_duckdb::RegexStringPieceArgs_*,_false>._M_head_impl =
       (unique_ptr<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>_>
       )(__uniq_ptr_data<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>,_true,_true>
         )0x0;
  stored_re.super_unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>._M_t.
  super___uniq_ptr_impl<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>._M_t.
  super__Tuple_impl<0UL,_duckdb_re2::RE2_*,_std::default_delete<duckdb_re2::RE2>_>.
  super__Head_base<0UL,_duckdb_re2::RE2_*,_false>._M_head_impl =
       (unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>)
       (__uniq_ptr_data<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true,_true>)0x0;
  if (info->constant_pattern == false) {
    make_uniq<duckdb::RegexStringPieceArgs>();
    _Var4._M_p = _group_index;
    _group_index = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>_>
    ::reset((__uniq_ptr_impl<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>_>
             *)&non_const_args,(pointer)_Var4._M_p);
    ::std::
    unique_ptr<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>_>::
    ~unique_ptr((unique_ptr<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>_>
                 *)&group_index);
  }
  else {
    pRVar9 = GetPattern(info,local_140,&stored_re);
    if (pRVar9->num_captures_ == -1) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&group_index,"Pattern failed to parse, error: \'%s\'",
                 (allocator *)&pattern_strpiece);
      ::std::__cxx11::string::string((string *)&local_98,(string *)pRVar9->error_);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (pIVar10,(string *)&group_index,&local_98);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  local_130 = &info->options;
  local_128 = &(local_188->validity).super_TemplatedValidityMask<unsigned_long>;
  local_170 = 8;
  row = 0;
  do {
    if (local_138 == row) {
      bVar5 = DataChunk::AllConstant(args);
      if (bVar5) {
        Vector::SetVectorType(local_188,CONSTANT_VECTOR);
      }
      ::std::unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>::~unique_ptr
                (&stored_re.super_unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>
                );
      ::std::
      unique_ptr<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>_>::
      ~unique_ptr(&non_const_args.
                   super_unique_ptr<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>_>
                 );
      UnifiedVectorFormat::~UnifiedVectorFormat(&pattern_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&strings_data);
      return;
    }
    bVar5 = true;
    if (info->constant_pattern == false) {
      iVar13 = row;
      if ((pattern_data.sel)->sel_vector != (sel_t *)0x0) {
        iVar13 = (idx_t)(pattern_data.sel)->sel_vector[row];
      }
      if ((pattern_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((pattern_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
           [iVar13 >> 6] >> (iVar13 & 0x3f) & 1) != 0)) {
        lVar11 = iVar13 * 0x10;
        pattern_strpiece.size_ = (size_type)*(uint *)(pattern_data.data + lVar11);
        if (pattern_strpiece.size_ < 0xd) {
          pattern_strpiece.data_ = (const_pointer)(pattern_data.data + lVar11 + 4);
        }
        else {
          pattern_strpiece.data_ = *(const_pointer *)(pattern_data.data + lVar11 + 8);
        }
        make_uniq<duckdb_re2::RE2,duckdb_re2::StringPiece&,duckdb_re2::RE2::Options_const&>
                  ((duckdb *)&group_index,&pattern_strpiece,local_130);
        _Var4._M_p = _group_index;
        _group_index = (pointer)0x0;
        ::std::__uniq_ptr_impl<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>::reset
                  ((__uniq_ptr_impl<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_> *)
                   &stored_re,(pointer)_Var4._M_p);
        ::std::unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_>::~unique_ptr
                  ((unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>_> *)
                   &group_index);
        pRVar12 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::
                  operator->(&stored_re);
        iVar2 = pRVar12->num_captures_;
        if ((long)iVar2 == 0xffffffffffffffff) {
          pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&group_index,"Pattern failed to parse, error: \'%s\'",&local_189);
          pRVar12 = unique_ptr<duckdb_re2::RE2,_std::default_delete<duckdb_re2::RE2>,_true>::
                    operator->(&stored_re);
          ::std::__cxx11::string::string((string *)&local_b8,(string *)pRVar12->error_);
          InvalidInputException::InvalidInputException<std::__cxx11::string>
                    (pIVar10,(string *)&group_index,&local_b8);
          __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        this_01 = unique_ptr<duckdb::RegexStringPieceArgs,_std::default_delete<duckdb::RegexStringPieceArgs>,_true>
                  ::operator->(&non_const_args);
        RegexStringPieceArgs::SetSize(this_01,(long)iVar2);
      }
      else {
        bVar5 = false;
      }
    }
    iVar13 = row;
    if ((strings_data.sel)->sel_vector != (sel_t *)0x0) {
      iVar13 = (idx_t)(strings_data.sel)->sel_vector[row];
    }
    if ((bVar5) &&
       ((strings_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0 ||
        ((strings_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
          [iVar13 >> 6] >> (iVar13 & 0x3f) & 1) != 0)))) {
      iVar6 = GetGroupIndex(args,row,&group_index);
      state_00 = local_140;
      if (iVar6 == 0) goto LAB_01a9aa96;
      pRVar9 = GetPattern(info,local_140,&stored_re);
      args_00 = GetGroupsBuffer(info,state_00,&non_const_args);
      ExtractSingleTuple((string_t *)(strings_data.data + iVar13 * 0x10),pRVar9,group_index,args_00,
                         local_188,row);
    }
    else {
LAB_01a9aa96:
      pdVar3 = local_188->data;
      FlatVector::VerifyFlatVector(local_188);
      pdVar1 = pdVar3 + local_170;
      pdVar1[0] = '\0';
      pdVar1[1] = '\0';
      pdVar1[2] = '\0';
      pdVar1[3] = '\0';
      pdVar1[4] = '\0';
      pdVar1[5] = '\0';
      pdVar1[6] = '\0';
      pdVar1[7] = '\0';
      iVar13 = ListVector::GetListSize(local_188);
      *(idx_t *)(pdVar3 + local_170 + -8) = iVar13;
      TemplatedValidityMask<unsigned_long>::SetInvalid(local_128,row);
    }
    row = row + 1;
    local_170 = local_170 + 0x10;
  } while( true );
}

Assistant:

void RegexpExtractAll::Execute(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	const auto &info = func_expr.bind_info->Cast<RegexpBaseBindData>();

	auto &strings = args.data[0];
	auto &patterns = args.data[1];
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	auto &output_child = ListVector::GetEntry(result);

	UnifiedVectorFormat strings_data;
	strings.ToUnifiedFormat(args.size(), strings_data);

	UnifiedVectorFormat pattern_data;
	patterns.ToUnifiedFormat(args.size(), pattern_data);

	ListVector::Reserve(result, STANDARD_VECTOR_SIZE);
	// Reference the 'strings' StringBuffer, because we won't need to allocate new data
	// for the result, all returned strings are substrings of the originals
	output_child.SetAuxiliary(strings.GetAuxiliary());

	// Avoid doing extra work if all the inputs are constant
	idx_t tuple_count = args.AllConstant() ? 1 : args.size();

	unique_ptr<RegexStringPieceArgs> non_const_args;
	unique_ptr<duckdb_re2::RE2> stored_re;
	if (!info.constant_pattern) {
		non_const_args = make_uniq<RegexStringPieceArgs>();
	} else {
		// Verify that the constant pattern is valid
		auto &re = GetPattern(info, state, stored_re);
		auto group_count_p = re.NumberOfCapturingGroups();
		if (group_count_p == -1) {
			throw InvalidInputException("Pattern failed to parse, error: '%s'", re.error());
		}
	}

	for (idx_t row = 0; row < tuple_count; row++) {
		bool pattern_valid = true;
		if (!info.constant_pattern) {
			// Check if the pattern is NULL or not,
			// and compile the pattern if it's not constant
			auto pattern_idx = pattern_data.sel->get_index(row);
			if (!pattern_data.validity.RowIsValid(pattern_idx)) {
				pattern_valid = false;
			} else {
				auto &pattern_p = UnifiedVectorFormat::GetData<string_t>(pattern_data)[pattern_idx];
				auto pattern_strpiece = CreateStringPiece(pattern_p);
				stored_re = make_uniq<duckdb_re2::RE2>(pattern_strpiece, info.options);

				// Increase the size of the args buffer if needed
				auto group_count_p = stored_re->NumberOfCapturingGroups();
				if (group_count_p == -1) {
					throw InvalidInputException("Pattern failed to parse, error: '%s'", stored_re->error());
				}
				non_const_args->SetSize(UnsafeNumericCast<idx_t>(group_count_p));
			}
		}

		auto string_idx = strings_data.sel->get_index(row);
		int32_t group_index;
		if (!pattern_valid || !strings_data.validity.RowIsValid(string_idx) || !GetGroupIndex(args, row, group_index)) {
			// If something is NULL, the result is NULL
			// FIXME: do we even need 'SPECIAL_HANDLING'?
			auto result_data = FlatVector::GetData<list_entry_t>(result);
			auto &result_validity = FlatVector::Validity(result);
			result_data[row].length = 0;
			result_data[row].offset = ListVector::GetListSize(result);
			result_validity.SetInvalid(row);
			continue;
		}

		auto &re = GetPattern(info, state, stored_re);
		auto &groups = GetGroupsBuffer(info, state, non_const_args);
		auto &string = UnifiedVectorFormat::GetData<string_t>(strings_data)[string_idx];
		ExtractSingleTuple(string, re, group_index, groups, result, row);
	}

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}